

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O1

time_t curl_getdate(char *p,time_t *now)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  time_t tVar9;
  uint uVar10;
  int i;
  uint uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  char **what;
  char **ppcVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  int secnum;
  int len;
  int minnum;
  int hournum;
  char buf [32];
  uint local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  byte *local_68;
  ulong local_60;
  byte *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  byte *local_38;
  
  iVar14 = -1;
  local_6c = -1;
  local_70 = -1;
  local_7c = -1;
  bVar19 = false;
  local_60 = 0xffffffff;
  iVar6 = 0;
  local_80 = 0xffffffff;
  uVar11 = 0xffffffff;
  lVar13 = 0xffffffff;
  local_38 = (byte *)p;
  do {
    bVar1 = *p;
    if ((bVar1 == 0) || (5 < iVar6)) {
      if (local_7c == -1) {
        local_6c = 0;
        local_70 = 0;
        local_7c = 0;
      }
      bVar19 = false;
      lVar13 = -1;
      iVar6 = (int)local_60;
      if (((local_80 == 0xffffffff) || (uVar11 == 0xffffffff)) || (iVar6 < 0x62f))
      goto LAB_004f8328;
      if ((local_7c < 0x3d && local_70 < 0x3c) &&
          (local_6c < 0x18 && ((int)uVar11 < 0xc && (int)local_80 < 0x20))) {
        uVar7 = uVar11;
        if ((int)uVar11 < 0) {
          uVar7 = (0xb - uVar11) / 0xc;
          iVar6 = iVar6 + uVar7;
          uVar7 = (uVar7 * 0xc - (0xb - uVar11)) + 0xb;
        }
        iVar5 = 0;
        if (iVar14 != -1) {
          iVar5 = iVar14;
        }
        iVar12 = iVar6 - (uint)((int)uVar11 < 2);
        iVar14 = (iVar6 - (uint)((int)uVar11 < 2)) + 3;
        if (-1 < iVar12) {
          iVar14 = iVar12;
        }
        iVar2 = (int)((ulong)((long)iVar12 * -0x51eb851f) >> 0x20);
        lVar13 = (long)local_7c + (long)iVar5 +
                 (((long)local_6c +
                  ((long)(iVar12 / 400 + ((iVar2 >> 5) - (iVar2 >> 0x1f)) + (iVar14 >> 2) + -0x1dd)
                  + (long)(iVar6 + -0x7b2) * 0x16d + (long)(int)local_80 +
                    (long)*(int *)(my_timegm_month_days_cumulative + (ulong)uVar7 * 4)) * 0x18) *
                  0x3c + (long)local_70) * 0x3c + -0x15180;
        bVar19 = true;
        goto LAB_004f8328;
      }
      break;
    }
    do {
      iVar5 = Curl_isalnum((uint)bVar1);
      if (iVar5 != 0) break;
      bVar1 = ((byte *)p)[1];
      p = (char *)((byte *)p + 1);
    } while (bVar1 != 0);
    iVar5 = Curl_isalpha((uint)(byte)*p);
    if (iVar5 == 0) {
      iVar5 = Curl_isdigit((uint)(byte)*p);
      if (iVar5 == 0) goto LAB_004f8282;
      local_74 = 0;
      if ((local_7c == -1) &&
         (iVar5 = __isoc99_sscanf(p,"%02d:%02d:%02d%n",&local_6c,&local_70,&local_7c,&local_74),
         iVar5 == 3)) {
LAB_004f7fe7:
        p = (char *)((byte *)p + local_74);
        bVar18 = true;
      }
      else {
        if ((local_7c == -1) &&
           (iVar5 = __isoc99_sscanf(p,"%02d:%02d%n",&local_6c,&local_70,&local_74), iVar5 == 2)) {
          local_7c = 0;
          goto LAB_004f7fe7;
        }
        local_68 = (byte *)CONCAT44(local_68._4_4_,iVar14);
        local_78 = iVar6;
        piVar8 = __errno_location();
        iVar14 = *piVar8;
        *piVar8 = 0;
        lVar16 = strtol(p,(char **)&local_58,10);
        iVar6 = local_78;
        iVar5 = *piVar8;
        if (iVar5 != iVar14) {
          *piVar8 = iVar14;
        }
        bVar18 = false;
        iVar14 = (int)local_68;
        if ((iVar5 == 0) && (0xfffffffeffffffff < lVar16 - 0x80000000U)) {
          uVar7 = curlx_sltosi(lVar16);
          if (iVar14 == -1) {
            iVar14 = -1;
            bVar3 = false;
            if (((local_38 < p) && (bVar3 = false, (long)local_58 - (long)p == 4)) &&
               (bVar3 = false, (int)uVar7 < 0x579)) {
              bVar1 = ((byte *)p)[-1];
              if ((bVar1 != 0x2d) && (bVar1 != 0x2b)) goto LAB_004f80ab;
              iVar5 = uVar7 + ((int)uVar7 / 100) * -0x28;
              iVar14 = iVar5 * -0x3c;
              if (bVar1 != 0x2b) {
                iVar14 = iVar5 * 0x3c;
              }
              bVar3 = true;
            }
          }
          else {
LAB_004f80ab:
            bVar3 = false;
          }
          local_68 = local_58;
          uVar10 = local_80;
          if ((((long)local_58 - (long)p == 8) && ((int)local_60 == -1)) &&
             ((uVar11 == 0xffffffff && (local_80 == 0xffffffff)))) {
            local_60 = (ulong)(uint)((int)uVar7 / 10000);
            uVar11 = ((int)uVar7 % 10000) / 100 - 1;
            bVar3 = true;
            uVar10 = (int)uVar7 % 100;
          }
          bVar17 = uVar7 - 1 < 0x1f;
          local_80 = 0xffffffff;
          if (bVar17) {
            local_80 = uVar7;
          }
          bVar4 = true;
          bVar18 = bVar3;
          if (bVar17) {
            bVar18 = true;
          }
          if (!(bool)(!bVar19 & ~bVar3 & uVar10 == 0xffffffff)) {
            local_80 = uVar10;
            bVar18 = bVar3;
            bVar4 = bVar19;
          }
          bVar19 = bVar4;
          if (((!bVar18) && (bVar4)) && ((int)local_60 == -1)) {
            if ((int)uVar7 < 100) {
              if ((int)uVar7 < 0x47) {
                uVar7 = uVar7 + 2000;
              }
              else {
                uVar7 = uVar7 + 0x76c;
              }
            }
            local_60 = (ulong)uVar7;
            bVar19 = local_80 != 0xffffffff;
            bVar18 = true;
          }
          if (bVar18) {
            p = (char *)local_58;
          }
        }
      }
      if (bVar18) goto LAB_004f8282;
      bVar18 = false;
    }
    else {
      local_48 = 0;
      uStack_40 = 0;
      local_58 = (byte *)0x0;
      uStack_50 = 0;
      iVar5 = __isoc99_sscanf(p,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              &local_58);
      if (iVar5 == 0) {
        local_68 = (byte *)0x0;
      }
      else {
        local_68 = (byte *)strlen((char *)&local_58);
      }
      if ((int)lVar13 == -1) {
        ppcVar15 = Curl_wkday;
        if ((byte *)0x3 < local_68) {
          ppcVar15 = weekday;
        }
        lVar13 = 0;
        local_78 = iVar6;
        do {
          iVar6 = Curl_strcasecompare((char *)&local_58,ppcVar15[lVar13]);
          if (iVar6 != 0) goto LAB_004f7f0a;
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != 7);
        lVar13 = 0xffffffff;
LAB_004f7f0a:
        bVar18 = (int)lVar13 != -1;
      }
      else {
        bVar18 = false;
        local_78 = iVar6;
      }
      if ((!bVar18) && (uVar11 == 0xffffffff)) {
        uVar11 = 0;
        ppcVar15 = Curl_month;
        do {
          iVar6 = Curl_strcasecompare((char *)&local_58,*ppcVar15);
          if (iVar6 != 0) goto LAB_004f7f4d;
          ppcVar15 = ppcVar15 + 1;
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0xc);
        uVar11 = 0xffffffff;
LAB_004f7f4d:
        bVar18 = uVar11 != 0xffffffff;
      }
      if ((!bVar18) && (iVar14 == -1)) {
        lVar16 = 0;
        do {
          iVar6 = Curl_strcasecompare((char *)&local_58,tz[0].name + lVar16);
          if (iVar6 != 0) {
            iVar14 = *(int *)(tz[0].name + lVar16 + 8) * 0x3c;
            goto LAB_004f7ffb;
          }
          lVar16 = lVar16 + 0xc;
        } while ((int)lVar16 != 0x33c);
        iVar14 = -1;
LAB_004f7ffb:
        bVar18 = iVar14 != -1;
      }
      iVar6 = local_78;
      if (bVar18) {
        p = (char *)((byte *)p + (long)local_68);
LAB_004f8282:
        bVar18 = true;
        iVar6 = iVar6 + 1;
      }
      else {
        bVar18 = false;
      }
    }
  } while (bVar18);
  lVar13 = -1;
  bVar19 = false;
LAB_004f8328:
  lVar16 = 0;
  if (lVar13 != -1) {
    lVar16 = lVar13;
  }
  tVar9 = -1;
  if (bVar19) {
    tVar9 = lVar16;
  }
  return tVar9;
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  if(rc == PARSEDATE_OK) {
    if(parsed == -1)
      /* avoid returning -1 for a working scenario */
      parsed++;
    return parsed;
  }
  /* everything else is fail */
  return -1;
}